

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem-C-API.cpp
# Opt level: O0

void anon_unknown.dwarf_5b8e::command_started(void *context,llb_buildsystem_command_t *command)

{
  undefined1 local_30 [8];
  llb_data_t name;
  char *description;
  llb_buildsystem_command_t *command_local;
  void *context_local;
  
  name.data = (uint8_t *)llb_buildsystem_command_get_description(command);
  llb_buildsystem_command_get_name(command,(llb_data_t *)local_30);
  printf("%s: %.*s -- %s\n","command_started",(ulong)local_30 & 0xffffffff,name.length,name.data);
  llb_free(name.data);
  fflush(_stdout);
  return;
}

Assistant:

static void command_started(void* context,
                            llb_buildsystem_command_t* command) {
  char* description = llb_buildsystem_command_get_description(command);
  llb_data_t name;
  llb_buildsystem_command_get_name(command, &name);
  printf("%s: %.*s -- %s\n", __FUNCTION__, (int)name.length, name.data,
         description);
  llb_free(description);
  fflush(stdout);
}